

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ostream * Catch::operator<<(ostream *os,SourceLineInfo *info)

{
  ostream *poVar1;
  undefined8 *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,(char *)*in_RSI);
  poVar1 = std::operator<<(poVar1,':');
  std::ostream::operator<<(poVar1,in_RSI[1]);
  return in_RDI;
}

Assistant:

std::ostream& operator << ( std::ostream& os, SourceLineInfo const& info ) {
#ifndef __GNUG__
        os << info.file << '(' << info.line << ')';
#else
        os << info.file << ':' << info.line;
#endif
        return os;
    }